

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

SHADING_RATE Diligent::VkFragmentSizeToShadingRate(VkExtent2D *Size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char (*Args_1) [24];
  char (*Args_1_00) [25];
  string msg;
  
  uVar2 = Size->width;
  uVar3 = uVar2 - 1;
  if (((uVar2 ^ uVar3) <= uVar3) || (uVar3 = Size->height, (uVar3 ^ uVar3 - 1) <= uVar3 - 1)) {
    FormatString<char[26],char[54]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(Size.width) && IsPowerOfTwo(Size.height)",
               (char (*) [54])(ulong)uVar3);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77b);
    std::__cxx11::string::~string((string *)&msg);
    uVar2 = Size->width;
    uVar3 = Size->height;
  }
  uVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  Args_1 = (char (*) [24])(ulong)uVar1;
  if (uVar2 == 0) {
    Args_1 = (char (*) [24])0x20;
  }
  uVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  Args_1_00 = (char (*) [25])(ulong)uVar1;
  if (uVar3 == 0) {
    Args_1_00 = (char (*) [25])0x20;
  }
  if (1 << ((byte)Args_1 & 0x1f) != uVar2) {
    FormatString<char[26],char[24]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(1u << X) == Size.width",Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77e);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (1 << ((SHADING_RATE)Args_1_00 & 0x1f) != Size->height) {
    FormatString<char[26],char[25]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(1u << Y) == Size.height",Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77f);
    std::__cxx11::string::~string((string *)&msg);
  }
  return (SHADING_RATE)((int)Args_1 << 2) | (SHADING_RATE)Args_1_00;
}

Assistant:

SHADING_RATE VkFragmentSizeToShadingRate(const VkExtent2D& Size)
{
    VERIFY_EXPR(IsPowerOfTwo(Size.width) && IsPowerOfTwo(Size.height));
    uint32_t X = PlatformMisc::GetMSB(Size.width);
    uint32_t Y = PlatformMisc::GetMSB(Size.height);
    VERIFY_EXPR((1u << X) == Size.width);
    VERIFY_EXPR((1u << Y) == Size.height);
    return static_cast<SHADING_RATE>((X << SHADING_RATE_X_SHIFT) | Y);
}